

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O1

bool __thiscall
GoState<3U,_4U>::is_alive
          (GoState<3U,_4U> *this,int i_start,int j_start,
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          *pieces)

{
  uchar uVar1;
  uchar uVar2;
  iterator iVar3;
  bool bVar4;
  bool bVar5;
  int j;
  int i;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> stack;
  value_type back;
  key_type local_70;
  uint local_68;
  uint local_64;
  int local_60;
  int local_5c;
  void *local_58;
  void *pvStack_50;
  undefined8 local_48;
  key_type local_38;
  
  if (this->board[i_start][j_start] == '\0') {
    bVar5 = true;
  }
  else {
    local_58 = (void *)0x0;
    pvStack_50 = (void *)0x0;
    local_48 = 0;
    local_60 = j_start;
    local_5c = i_start;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::clear(&pieces->_M_t);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,&local_5c,
               &local_60);
    bVar5 = local_58 != pvStack_50;
    if (bVar5) {
      uVar1 = this->board[local_5c][local_60];
      do {
        local_38 = *(key_type *)((long)pvStack_50 + -8);
        pvStack_50 = (void *)((long)pvStack_50 + -8);
        iVar3 = std::
                _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                ::find(&pieces->_M_t,&local_38);
        bVar4 = false;
        if ((_Rb_tree_header *)iVar3._M_node == &(pieces->_M_t)._M_impl.super__Rb_tree_header) {
          local_64 = local_38.first;
          local_68 = local_38.second;
          uVar2 = this->board[local_38.first][local_38.second];
          if (uVar2 == uVar1) {
            local_70 = local_38;
            std::
            _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
            ::_M_insert_unique<std::pair<int,int>>
                      ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                        *)pieces,&local_70);
            if (0 < (int)local_64) {
              local_70.first = local_64 - 1;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<int,int&>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         &local_70.first,(int *)&local_68);
            }
            if (local_64 < 2) {
              local_70.first = local_64 + 1;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<int,int&>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         &local_70.first,(int *)&local_68);
            }
            if (0 < (int)local_68) {
              local_70.first = local_68 - 1;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<int&,int>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         (int *)&local_64,&local_70.first);
            }
            if (local_68 < 3) {
              local_70.first = local_68 + 1;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<int&,int>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         (int *)&local_64,&local_70.first);
            }
          }
          else if (uVar2 == '\0') {
            bVar4 = true;
            goto LAB_0014212f;
          }
          bVar4 = false;
        }
LAB_0014212f:
      } while ((!bVar4) && (bVar5 = local_58 != pvStack_50, bVar5));
    }
    if (local_58 != (void *)0x0) {
      operator_delete(local_58);
    }
  }
  return bVar5;
}

Assistant:

virtual bool is_alive(int i_start, int j_start, std::set<std::pair<int, int>>* pieces) const
	{
		if (board[i_start][j_start] == empty) {
			// No piece here, so alive
			return true;
		}

		std::vector<std::pair<int, int>> stack;
		pieces->clear();
		stack.emplace_back(i_start, j_start);
		int player = board[i_start][j_start];

		while (!stack.empty()) {
			auto back = stack.back();
			stack.pop_back();
			if (pieces->find(back) != pieces->end()) {
				// Already checked.
				continue;
			}
			int i,j;
			std::tie(i, j) = back;
			
			if (board[i][j] == player) {

				// Does not work in older GCC.
				//pieces->emplace(i, j);
				pieces->insert(std::make_pair(i, j));

				if (i > 0) {
					stack.emplace_back(i - 1, j);
				}
				if (i < M - 1) {
					stack.emplace_back(i + 1, j);
				}
				if (j > 0) {
					stack.emplace_back(i, j - 1);
				}
				if (j < N - 1) {
					stack.emplace_back(i, j + 1);
				}
			}
			else if (board[i][j] == empty) {
				// Alive.
				return true;
			}
		}
		return false;
	}